

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

bool __thiscall
ON_SimpleArray<ON_Internal_ExtrudedEdge>::QuickSort
          (ON_SimpleArray<ON_Internal_ExtrudedEdge> *this,
          _func_int_ON_Internal_ExtrudedEdge_ptr_ON_Internal_ExtrudedEdge_ptr *compar)

{
  bool local_19;
  bool rc;
  _func_int_ON_Internal_ExtrudedEdge_ptr_ON_Internal_ExtrudedEdge_ptr *compar_local;
  ON_SimpleArray<ON_Internal_ExtrudedEdge> *this_local;
  
  local_19 = false;
  if (((this->m_a != (ON_Internal_ExtrudedEdge *)0x0) && (0 < this->m_count)) &&
     (compar != (_func_int_ON_Internal_ExtrudedEdge_ptr_ON_Internal_ExtrudedEdge_ptr *)0x0)) {
    if (1 < this->m_count) {
      ON_qsort(this->m_a,(long)this->m_count,0x40,(_func_int_void_ptr_void_ptr *)compar);
    }
    local_19 = true;
  }
  return local_19;
}

Assistant:

bool ON_SimpleArray<T>::QuickSort( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar ) {
    if ( m_count > 1 )
      ON_qsort( m_a, m_count, sizeof(T), (int(*)(const void*,const void*))compar );
    rc = true;
  }
  return rc;
}